

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::DirectionalAtomTypesSectionParser::parseLine
          (DirectionalAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  DirectionalAdapter da;
  string atomTypeName;
  Mat3x3d I;
  StringTokenizer tokenizer;
  DirectionalAdapter local_128;
  string local_120;
  RectMatrix<double,_3U,_3U> local_100;
  StringTokenizer local_b8;
  RectMatrix<double,_3U,_3U> local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100," ;\t\n\r",(allocator<char> *)&local_120);
  StringTokenizer::StringTokenizer(&local_b8,line,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  iVar1 = StringTokenizer::countTokens(&local_b8);
  if (iVar1 < 4) {
    snprintf(painCave.errMsg,2000,
             "DirectionalAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_120,&local_b8);
    local_128.at_ = ForceField::getAtomType(ff,&local_120);
    if (local_128.at_ == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "DirectionalAtomTypesSectionParser:: AtomType %s was not\n\tdeclared in the BaseAtomTypes or AtomTypes before being\n\tdeclared as a DirectionalAtomType!\n"
               ,local_120._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_100);
    local_100.data_[0][0] = StringTokenizer::nextTokenAsDouble(&local_b8);
    local_100.data_[1][1] = StringTokenizer::nextTokenAsDouble(&local_b8);
    local_100.data_[2][2] = StringTokenizer::nextTokenAsDouble(&local_b8);
    RectMatrix<double,_3U,_3U>::operator=(&local_60,&local_100);
    DirectionalAdapter::makeDirectional(&local_128,(Mat3x3d *)&local_60);
    std::__cxx11::string::~string((string *)&local_120);
  }
  StringTokenizer::~StringTokenizer(&local_b8);
  return;
}

Assistant:

void DirectionalAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in DirectionalAtomTypeSection, a line contains 4 tokens

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DirectionalAtomTypesSectionParser:: AtomType %s was not\n"
                 "\tdeclared in the BaseAtomTypes or AtomTypes before being\n"
                 "\tdeclared as a DirectionalAtomType!\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

      DirectionalAdapter da = DirectionalAdapter(atomType);
      Mat3x3d I;

      I(0, 0) = tokenizer.nextTokenAsDouble();
      I(1, 1) = tokenizer.nextTokenAsDouble();
      I(2, 2) = tokenizer.nextTokenAsDouble();

      da.makeDirectional(I);
    }
  }